

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uws_client.c
# Opt level: O1

int process_frame_fragment(UWS_CLIENT_INSTANCE *uws_client,size_t length,size_t needed_bytes)

{
  size_t sVar1;
  uchar *puVar2;
  LOGGER_LOG p_Var3;
  size_t __size;
  
  __size = 0xffffffffffffffff;
  if (!CARRY8(uws_client->fragment_buffer_count,length)) {
    __size = uws_client->fragment_buffer_count + length;
  }
  if ((__size != 0xffffffffffffffff) &&
     (puVar2 = (uchar *)realloc(uws_client->fragment_buffer,__size), puVar2 != (uchar *)0x0)) {
    uws_client->fragment_buffer = puVar2;
    sVar1 = uws_client->fragment_buffer_count;
    memcpy(puVar2 + sVar1,uws_client->stream_buffer + (needed_bytes - length),length);
    uws_client->fragment_buffer_count = sVar1 + length;
    return 0;
  }
  p_Var3 = xlogging_get_log_function();
  if (p_Var3 != (LOGGER_LOG)0x0) {
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
              ,"process_frame_fragment",0x426,1,"Cannot allocate memory for received data");
  }
  uws_client->uws_state = UWS_STATE_ERROR;
  (*uws_client->on_ws_error)(uws_client->on_ws_error_context,WS_ERROR_NOT_ENOUGH_MEMORY);
  return 0x428;
}

Assistant:

static int process_frame_fragment(UWS_CLIENT_INSTANCE *uws_client, size_t length, size_t needed_bytes)
{
    int result;
    unsigned char* new_fragment_bytes;
    size_t realloc_size = safe_add_size_t(uws_client->fragment_buffer_count, length);
    if (realloc_size == SIZE_MAX ||
        (new_fragment_bytes = (unsigned char*)realloc(uws_client->fragment_buffer, realloc_size)) == NULL)
    {
        /* Codes_SRS_UWS_CLIENT_01_379: [ If allocating memory for accumulating the bytes fails, uws shall report that the open failed by calling the on_ws_open_complete callback passed to uws_client_open_async with WS_OPEN_ERROR_NOT_ENOUGH_MEMORY. ]*/
        LogError("Cannot allocate memory for received data");
        indicate_ws_error(uws_client, WS_ERROR_NOT_ENOUGH_MEMORY);
        result = MU_FAILURE;
    }
    else
    {
        uws_client->fragment_buffer = new_fragment_bytes;
        (void)memcpy(uws_client->fragment_buffer + uws_client->fragment_buffer_count, uws_client->stream_buffer + needed_bytes - length, length);
        uws_client->fragment_buffer_count += length;
        result = 0;
    }

    return result;
}